

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O2

DS_STATUS ds_entry_append(DsListEntry **entryAdd,DsListEntry *in)

{
  DsListEntry *pDVar1;
  DsListEntry *pDVar2;
  
  if (entryAdd != (DsListEntry **)0x0) {
    pDVar1 = *entryAdd;
    if (*entryAdd == (DsListEntry *)0x0) {
      *entryAdd = in;
    }
    else {
      do {
        pDVar2 = pDVar1;
        pDVar1 = pDVar2->next;
      } while (pDVar2->next != (DsListEntry *)0x0);
      pDVar2->next = in;
      in->next = (DsListEntry *)0x0;
      in->prev = pDVar2;
    }
    return DS_STATUS_OK;
  }
  return DS_STATUS_NULL;
}

Assistant:

static DS_STATUS ds_entry_append(DsListEntry **entryAdd, DsListEntry *in)
{
    if (NULL == entryAdd || NULL == in)
        return DS_STATUS_NULL;
    if (NULL == *entryAdd)
        *entryAdd = in;
    else
    {
        DsListEntry *entry = *entryAdd;
        while (entry->next)
            entry = entry->next;
        entry->next = in;
        in->next = NULL;
        in->prev = entry;
    }
    return DS_STATUS_OK;
}